

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *file_name;
  char *__lhs;
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  runtime_error *this;
  long lVar5;
  long lVar6;
  pointer ppVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>
  __l;
  allocator_type local_2e1;
  long local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
  tests;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_280;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_278;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_270;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_268;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_260;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_258;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_250;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_248;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_240;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr *local_238;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reference;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_1f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_1c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_150;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
  local_60;
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Pass a filename to read\n");
    iVar2 = 1;
  }
  else {
    file_name = argv[1];
    if (argc == 2) {
      bVar1 = false;
    }
    else {
      __lhs = argv[2];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reference,"check",(allocator<char> *)&tests);
      bVar1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&reference);
      std::__cxx11::string::~string((string *)&reference);
    }
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_unknown.dwarf_b963::read_stdio_inc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[23],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
                *)&reference,(char (*) [23])"stdio incremental read",
               (_func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr **)&v);
    local_230._M_impl.super__Vector_impl_data._M_start =
         (pointer)anon_unknown.dwarf_b963::read_modern_inc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[28],_true>
              (&local_1f0,(char (*) [28])"modern::io incremental read",
               (_func_vector<unsigned_char,_std::allocator<unsigned_char>_>_char_ptr **)&local_230);
    local_238 = anon_unknown.dwarf_b963::read_stdio_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[24],_true>(&local_1c8,(char (*) [24])"stdio preallocated read",&local_238)
    ;
    local_240 = anon_unknown.dwarf_b963::read_iostream_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[27],_true>
              (&local_1a0,(char (*) [27])"iostream preallocated read",&local_240);
    local_248 = anon_unknown.dwarf_b963::read_modern_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[29],_true>
              (&local_178,(char (*) [29])"modern::io preallocated read",&local_248);
    local_250 = anon_unknown.dwarf_b963::read_modern_mmap_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[34],_true>
              (&local_150,(char (*) [34])"modern::io preallocated mmap read",&local_250);
    local_258 = anon_unknown.dwarf_b963::read_iostream_range;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[32],_true>
              (&local_128,(char (*) [32])"iostream incremental range read",&local_258);
    local_260 = anon_unknown.dwarf_b963::read_modern_range;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[34],_true>
              (&local_100,(char (*) [34])"modern::io incremental range read",&local_260);
    local_268 = anon_unknown.dwarf_b963::read_modern_mmap_range;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[39],_true>
              (&local_d8,(char (*) [39])"modern::io incremental mmap range read",&local_268);
    local_270 = anon_unknown.dwarf_b963::read_iostream_range_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[33],_true>
              (&local_b0,(char (*) [33])"iostream preallocated range read",&local_270);
    local_278 = anon_unknown.dwarf_b963::read_modern_range_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[35],_true>
              (&local_88,(char (*) [35])"modern::io preallocated range read",&local_278);
    local_280 = anon_unknown.dwarf_b963::read_modern_mmap_range_prealloc;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>
    ::pair<const_char_(&)[40],_true>
              (&local_60,(char (*) [40])"modern::io preallocated mmap range read",&local_280);
    __l._M_len = 0xc;
    __l._M_array = (iterator)&reference;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
    ::vector(&tests,__l,&local_2e1);
    lVar6 = 0x1b8;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&reference.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar6));
      lVar6 = lVar6 + -0x28;
    } while (lVar6 != -0x28);
    reference.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    reference.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    reference.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::operator<<((ostream *)&std::cout,"warming cache and checking disk speed... ");
    std::ostream::flush();
    lVar6 = std::chrono::_V2::system_clock::now();
    anon_unknown.dwarf_b963::read_stdio_inc(&v,file_name);
    lVar3 = std::chrono::_V2::system_clock::now();
    lVar5 = (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (bVar1 != false) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&reference,&v,(lVar3 - lVar6) % 1000);
    }
    std::operator<<((ostream *)&std::cout,"done\n");
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    lVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2000000)) / SEXT816((lVar3 - lVar6) / 1000),0);
    local_2e0 = 1;
    if (1 < lVar6) {
      local_2e0 = lVar6;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Performing ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," read(s) of ");
    poVar4 = std::operator<<(poVar4,file_name);
    poVar4 = std::operator<<(poVar4," (");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," bytes, ");
    lVar5 = lVar5 * local_2e0;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," total) per test");
    std::endl<char,std::char_traits<char>>(poVar4);
    auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = 0x45300000;
    for (ppVar7 = tests.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 != tests.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)ppVar7);
      std::operator<<(poVar4," ");
      lVar3 = std::chrono::_V2::system_clock::now();
      v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar6 = local_2e0;
      while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
        (*ppVar7->second)((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,
                          file_name);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,&local_230);
        io::detail::black_box_impl
                  (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_230);
      }
      lVar6 = std::chrono::_V2::system_clock::now();
      if (bVar1 != false) {
        bVar8 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                ,&reference);
        if (bVar8) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"read does not match reference output");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"took ");
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::operator<<(poVar4,"ms (");
      poVar4 = std::ostream::_M_insert<double>
                         (((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                          ((double)((lVar6 - lVar3) / 1000000) * 1000.0));
      std::operator<<(poVar4,"MB/s)\n");
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&reference.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(*)(const_char_*)>_>_>
    ::~vector(&tests);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cout << "Pass a filename to read\n";
        return 1;
    }

    auto file_name = argv[1];
    const bool check = argc > 2 && argv[2] == std::string("check");

    using test_entry = std::pair<std::string, std::vector<std::uint8_t>(*)(const char*)>;
#ifdef _POSIX_VERSION
    const std::vector<test_entry> tests {
            { "stdio incremental read", read_stdio_inc },
            { "modern::io incremental read", read_modern_inc },
            { "stdio preallocated read", read_stdio_prealloc },
            { "iostream preallocated read", read_iostream_prealloc },
            { "modern::io preallocated read", read_modern_prealloc },
            { "modern::io preallocated mmap read", read_modern_mmap_prealloc },
            { "iostream incremental range read", read_iostream_range },
            { "modern::io incremental range read", read_modern_range },
            { "modern::io incremental mmap range read", read_modern_mmap_range },
            { "iostream preallocated range read", read_iostream_range_prealloc },
            { "modern::io preallocated range read", read_modern_range_prealloc },
            { "modern::io preallocated mmap range read", read_modern_mmap_range_prealloc },
    };
#else // !_POSIX_VERSION
    const std::vector<test_entry> tests {
            { "stdio incremental read", read_stdio_inc },
            { "modern::io incremental read", read_modern_inc },
            { "stdio preallocated read", read_stdio_prealloc },
            { "iostream preallocated read", read_iostream_prealloc },
            { "modern::io preallocated read", read_modern_prealloc },
            { "iostream incremental range read", read_iostream_range },
            { "modern::io incremental range read", read_modern_range },
            { "iostream preallocated range read", read_iostream_range_prealloc },
            { "modern::io preallocated range read", read_modern_range_prealloc },
    };
#endif // _POSIX_VERSION

    std::chrono::microseconds reference_time;
    std::size_t file_size = 0;

    std::vector<uint8_t> reference;
    {
        std::cout << "warming cache and checking disk speed... " << std::flush;
        timer t{};
        auto v = read_stdio_inc(file_name);
        reference_time = t.elapsed<std::chrono::microseconds>();
        file_size = v.size();
        if (check) {
            reference = std::move(v);
        }
        std::cout << "done\n";
    }

    // A good heuristic for meaningful results seems to be to make the fastest
    // tests take ~2 seconds
    auto n_times = std::max<long>(std::chrono::seconds{2}/reference_time, 1);

    std::cout << "Performing " << n_times << " read(s) of "
              << file_name << " (" << file_size << " bytes, "
              << file_size * n_times << " total) per test" << std::endl;

    for (const auto& test : tests) {
        std::cout << test.first << " ";
        try {
            auto t = timer{};
            std::vector<std::uint8_t> v;
            for (int i = 0; i < n_times; i++) {
                io::black_box(v = test.second(file_name));
            }
            auto e = t.elapsed();
            if (check && v != reference) {
                throw std::runtime_error{"read does not match reference output"};
            }
            std::cout << "took " << e.count() << "ms ("
                      << n_times * file_size/(1000.0 * e.count()) << "MB/s)\n";
        } catch (const std::exception& e){
            std::cout << "-- ERROR " << e.what() << "\n";
        }
    }
}